

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

string * __thiscall
phosg::JSON::serialize_abi_cxx11_
          (string *__return_storage_ptr__,JSON *this,uint32_t options,size_t indent_level)

{
  bool bVar1;
  char *pcVar2;
  int64_t __val;
  string *s;
  list_type *this_00;
  size_type sVar3;
  size_type sVar4;
  pointer pJVar5;
  dict_type *this_01;
  reference pvVar6;
  reference key;
  type value;
  parse_error *this_02;
  bool bVar7;
  char *local_400;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  reference local_338;
  value_type *o_3;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  dict_type *__range4_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>
  *o_2;
  iterator __end4_1;
  iterator __begin4_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
  *__range4_1;
  pointer local_2e8;
  reference local_2e0;
  value_type *o_1;
  const_iterator __end4;
  const_iterator __begin4;
  dict_type *__range4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
  sorted;
  anon_class_40_5_0b9c1222 add_key;
  undefined1 local_260 [8];
  string ret_2;
  dict_type *dict;
  undefined1 local_228 [5];
  bool sort_keys;
  bool format_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  reference local_120;
  unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_> *o;
  const_iterator __end3;
  const_iterator __begin3;
  list_type *__range3;
  undefined1 local_f8 [8];
  string ret_1;
  list_type *list;
  undefined1 local_c0 [7];
  bool format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined4 local_7c;
  undefined1 local_78 [8];
  string ret;
  int64_t v;
  allocator<char> local_39;
  char *local_38;
  size_t type_index;
  size_t sStack_28;
  StringEscapeMode escape_mode;
  size_t indent_level_local;
  JSON *pJStack_18;
  uint32_t options_local;
  JSON *this_local;
  
  if ((options & 0x20) == 0) {
    type_index._4_4_ = (StringEscapeMode)((options & 0x10) != 0);
  }
  else {
    type_index._4_4_ = CONTROL_ONLY;
  }
  sStack_28 = indent_level;
  indent_level_local._4_4_ = options;
  pJStack_18 = this;
  this_local = (JSON *)__return_storage_ptr__;
  local_38 = ::std::
             variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
             ::index(&this->value,(char *)this,options);
  switch(local_38) {
  case (char *)0x0:
    pcVar2 = "null";
    if ((indent_level_local._4_4_ & 2) != 0) {
      pcVar2 = "n";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,&local_39);
    ::std::allocator<char>::~allocator(&local_39);
    break;
  case (char *)0x1:
    if ((indent_level_local._4_4_ & 2) == 0) {
      bVar1 = as_bool(this);
      pcVar2 = "false";
      if (bVar1) {
        pcVar2 = "true";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)((long)&v + 2));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&v + 2));
    }
    else {
      bVar1 = as_bool(this);
      if (bVar1) {
        local_400 = "\\t";
      }
      else {
        local_400 = "\\f";
      }
      local_400 = local_400 + 1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,local_400,(allocator<char> *)((long)&v + 3));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&v + 3));
    }
    break;
  case (char *)0x2:
    ret.field_2._8_8_ = as_int(this);
    if ((indent_level_local._4_4_ & 1) == 0) {
      __val = as_int(this);
      ::std::__cxx11::to_string(__return_storage_ptr__,__val);
    }
    else if ((long)ret.field_2._8_8_ < 0) {
      string_printf_abi_cxx11_(__return_storage_ptr__,"-0x%lX",-ret.field_2._8_8_);
    }
    else {
      string_printf_abi_cxx11_(__return_storage_ptr__,"0x%lX",ret.field_2._8_8_);
    }
    break;
  case (char *)0x3:
    as_float(this);
    string_printf_abi_cxx11_((string *)local_78,"%g");
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,'.',0);
    if (sVar4 == 0xffffffffffffffff) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,".0");
    }
    else {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    }
    local_7c = 1;
    ::std::__cxx11::string::~string((string *)local_78);
    break;
  case (char *)0x4:
    s = as_string_abi_cxx11_(this);
    escape_string((string *)local_c0,s,type_index._4_4_);
    ::std::operator+(&local_a0,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,&local_a0,"\"");
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)local_c0);
    break;
  case (char *)0x5:
    bVar7 = (indent_level_local._4_4_ & 4) == 0;
    this_00 = as_list(this);
    bVar1 = ::std::
            vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
            ::empty(this_00);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[]",
                 (allocator<char> *)(ret_1.field_2._M_local_buf + 0xf));
      ::std::allocator<char>::~allocator((allocator<char> *)(ret_1.field_2._M_local_buf + 0xf));
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,"[",(allocator<char> *)((long)&__range3 + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      __end3 = ::std::
               vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
               ::begin(this_00);
      o = (unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_> *)
          ::std::
          vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
          ::end(this_00);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                               (&__end3,(__normal_iterator<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                                         *)&o), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_120 = __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                    ::operator*(&__end3);
        sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
        if (1 < sVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     ',');
        }
        if (bVar7) {
          pJVar5 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator->
                             (local_120);
          serialize_abi_cxx11_(&local_1c8,pJVar5,indent_level_local._4_4_,0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                    );
          ::std::__cxx11::string::~string((string *)&local_1c8);
        }
        else {
          sVar4 = sStack_28 + 2;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,sVar4,' ',&local_181);
          ::std::operator+(&local_160,'\n',&local_180);
          pJVar5 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator->
                             (local_120);
          serialize_abi_cxx11_(&local_1a8,pJVar5,indent_level_local._4_4_,sStack_28 + 2);
          ::std::operator+(&local_140,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_160,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     &local_140);
          ::std::__cxx11::string::~string((string *)&local_140);
          ::std::__cxx11::string::~string((string *)&local_1a8);
          ::std::__cxx11::string::~string((string *)&local_160);
          ::std::__cxx11::string::~string((string *)&local_180);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_*,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
        ::operator++(&__end3);
      }
      if (bVar7) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,"]");
      }
      else {
        ::std::operator+(&local_208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,'\n');
        sVar4 = sStack_28;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_228,sVar4,' ',(allocator<char> *)((long)&dict + 7));
        ::std::operator+(&local_1e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_228);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,&local_1e8,"]");
        ::std::__cxx11::string::~string((string *)&local_1e8);
        ::std::__cxx11::string::~string((string *)local_228);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&dict + 7));
        ::std::__cxx11::string::~string((string *)&local_208);
      }
      local_7c = 1;
      ::std::__cxx11::string::~string((string *)local_f8);
    }
    break;
  case (char *)0x6:
    dict._6_1_ = (indent_level_local._4_4_ & 4) != 0;
    dict._5_1_ = (indent_level_local._4_4_ & 8) != 0;
    this_01 = as_dict_abi_cxx11_(this);
    bVar1 = ::std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
            ::empty(this_01);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"{}",
                 (allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
      ::std::allocator<char>::~allocator((allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_260,"{",(allocator<char> *)((long)&add_key.options + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&add_key.options + 7));
      sorted._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_260;
      add_key.ret = (string *)((long)&type_index + 4);
      add_key.escape_mode = (StringEscapeMode *)((long)&dict + 6);
      add_key.format = (bool *)&stack0xffffffffffffffd8;
      add_key.indent_level = (size_t *)((long)&indent_level_local + 4);
      if ((dict._5_1_ & 1) == 0) {
        __end4_2 = ::std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                   ::begin(this_01);
        o_3 = (value_type *)
              ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
              ::end(this_01);
        while (bVar1 = ::std::__detail::operator==
                                 (&__end4_2.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                  ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                    *)&o_3), ((bVar1 ^ 0xffU) & 1) != 0) {
          pvVar6 = ::std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
                   ::operator*(&__end4_2);
          local_338 = pvVar6;
          value = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*
                            (&pvVar6->second);
          serialize::anon_class_40_5_0b9c1222::operator()
                    ((anon_class_40_5_0b9c1222 *)
                     &sorted._M_t._M_impl.super__Rb_tree_header._M_node_count,&pvVar6->first,value);
          ::std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
          ::operator++(&__end4_2);
        }
      }
      else {
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
               *)&__range4);
        __end4 = ::std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                 ::begin(this_01);
        o_1 = (value_type *)
              ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
              ::end(this_01);
        while (bVar1 = ::std::__detail::operator==
                                 (&__end4.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                  ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                    *)&o_1), ((bVar1 ^ 0xffU) & 1) != 0) {
          pvVar6 = ::std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
                   ::operator*(&__end4);
          local_2e0 = pvVar6;
          local_2e8 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::get
                                (&pvVar6->second);
          ::std::
          map<std::__cxx11::string,phosg::JSON*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::JSON*>>>
          ::emplace<std::__cxx11::string_const&,phosg::JSON*>
                    ((map<std::__cxx11::string,phosg::JSON*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::JSON*>>>
                      *)&__range4,&pvVar6->first,&local_2e8);
          ::std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
          ::operator++(&__end4);
        }
        __end4_1 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
                            *)&__range4);
        o_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>
               *)::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
                        *)&__range4);
        while (bVar1 = ::std::operator==(&__end4_1,(_Self *)&o_2), ((bVar1 ^ 0xffU) & 1) != 0) {
          key = ::std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>
                ::operator*(&__end4_1);
          serialize::anon_class_40_5_0b9c1222::operator()
                    ((anon_class_40_5_0b9c1222 *)
                     &sorted._M_t._M_impl.super__Rb_tree_header._M_node_count,&key->first,
                     key->second);
          ::std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>
          ::operator++(&__end4_1);
        }
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
                *)&__range4);
      }
      if ((dict._6_1_ & 1) == 0) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_260,"}");
      }
      else {
        ::std::operator+(&local_378,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_260,'\n');
        sVar4 = sStack_28;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,sVar4,' ',&local_399);
        ::std::operator+(&local_358,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_378,&local_398);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,&local_358,"}");
        ::std::__cxx11::string::~string((string *)&local_358);
        ::std::__cxx11::string::~string((string *)&local_398);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_399);
        ::std::__cxx11::string::~string((string *)&local_378);
      }
      local_7c = 1;
      ::std::__cxx11::string::~string((string *)local_260);
    }
    break;
  default:
    this_02 = (parse_error *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"unknown object type",&local_3c1);
    parse_error::parse_error(this_02,&local_3c0);
    __cxa_throw(this_02,&parse_error::typeinfo,parse_error::~parse_error);
  }
  return __return_storage_ptr__;
}

Assistant:

string JSON::serialize(uint32_t options, size_t indent_level) const {
  StringEscapeMode escape_mode;
  if (options & SerializeOption::ESCAPE_CONTROLS_ONLY) {
    escape_mode = StringEscapeMode::CONTROL_ONLY;
  } else if (options & SerializeOption::HEX_ESCAPE_CODES) {
    escape_mode = StringEscapeMode::HEX;
  } else {
    escape_mode = StringEscapeMode::STANDARD;
  }

  size_t type_index = this->value.index();
  switch (type_index) {
    case 0: // nullptr_t
      return (options & SerializeOption::ONE_CHARACTER_TRIVIAL_CONSTANTS) ? "n" : "null";

    case 1: // bool
      if (options & SerializeOption::ONE_CHARACTER_TRIVIAL_CONSTANTS) {
        return this->as_bool() ? "t" : "f";
      } else {
        return this->as_bool() ? "true" : "false";
      }

    case 2: { // int64_t
      int64_t v = this->as_int();
      if (options & SerializeOption::HEX_INTEGERS) {
        return v < 0 ? string_printf("-0x%" PRIX64, -v) : string_printf("0x%" PRIX64, v);
      } else {
        return to_string(this->as_int());
      }
    }

    case 3: { // double
      string ret = string_printf("%g", this->as_float());
      if (ret.find('.') == string::npos) {
        return ret + ".0";
      }
      return ret;
    }

    case 4: // string
      return "\"" + JSON::escape_string(this->as_string(), escape_mode) + "\"";

    case 5: { // list_type
      bool format = options & SerializeOption::FORMAT;

      const auto& list = this->as_list();
      if (list.empty()) {
        return "[]";
      }

      string ret = "[";
      for (const unique_ptr<JSON>& o : list) {
        if (ret.size() > 1) {
          ret += ',';
        }
        if (format) {
          ret += '\n' + string(indent_level + 2, ' ') + o->serialize(options, indent_level + 2);
        } else {
          ret += o->serialize(options);
        }
      }
      if (format) {
        return ret + '\n' + string(indent_level, ' ') + "]";
      } else {
        return ret + "]";
      }
    }

    case 6: { // dict_type
      bool format = options & SerializeOption::FORMAT;
      bool sort_keys = options & SerializeOption::SORT_DICT_KEYS;

      const auto& dict = this->as_dict();
      if (dict.empty()) {
        return "{}";
      }

      string ret = "{";
      auto add_key = [&](const string& key, const JSON& value) -> void {
        if (ret.size() > 1) {
          ret += ',';
        }
        string escaped_key = JSON::escape_string(key, escape_mode);
        if (format) {
          ret += '\n' + string(indent_level + 2, ' ') + "\"" + escaped_key + "\": " + value.serialize(options, indent_level + 2);
        } else {
          ret += "\"" + escaped_key + "\":" + value.serialize(options);
        }
      };

      if (sort_keys) {
        // Note: We're kind of breaking abstraction here (the values in sorted
        // point to objects owned by unique_ptrs) but the lifetimes of these
        // objects are assumed to span this entire function, so it's ok to do
        // this temporarily.
        map<string, JSON*> sorted;
        for (const auto& o : dict) {
          sorted.emplace(o.first, o.second.get());
        }
        for (const auto& o : sorted) {
          add_key(o.first, *o.second);
        }
      } else {
        for (const auto& o : dict) {
          add_key(o.first, *o.second);
        }
      }
      if (format) {
        return ret + '\n' + string(indent_level, ' ') + "}";
      } else {
        return ret + "}";
      }
    }

    default:
      throw parse_error("unknown object type");
  }
}